

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

PixelBufferAccess * __thiscall
vkt::pipeline::TestTextureCubeArray::getLevel
          (PixelBufferAccess *__return_storage_ptr__,TestTextureCubeArray *this,int level,int layer)

{
  int iVar1;
  int iVar2;
  PixelBufferAccess levelLayers;
  
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&levelLayers.super_ConstPixelBufferAccess,
             &(this->m_texture).super_TextureLevelPyramid.m_access.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start[level].super_ConstPixelBufferAccess);
  iVar2 = layer * levelLayers.super_ConstPixelBufferAccess.m_size.m_data[0] *
          levelLayers.super_ConstPixelBufferAccess.m_size.m_data[1];
  iVar1 = tcu::TextureFormat::getPixelSize(&levelLayers.super_ConstPixelBufferAccess.m_format);
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,&levelLayers.super_ConstPixelBufferAccess.m_format,
             levelLayers.super_ConstPixelBufferAccess.m_size.m_data[0],
             levelLayers.super_ConstPixelBufferAccess.m_size.m_data[1],1,
             (void *)((ulong)(uint)(iVar2 * iVar1) +
                     (long)levelLayers.super_ConstPixelBufferAccess.m_data));
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess TestTextureCubeArray::getLevel (int level, int layer)
{
	const tcu::PixelBufferAccess	levelLayers	= m_texture.getLevel(level);
	const deUint32					layerSize	= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();
	const deUint32					layerOffset	= layerSize * layer;

	return tcu::PixelBufferAccess(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
}